

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O0

void __thiscall vm_test_disassemble_bad_Test::TestBody(vm_test_disassemble_bad_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  allocator<unsigned_char> local_ab;
  uchar local_aa [2];
  iterator local_a8;
  size_type local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  prog_chunk local_80;
  allocator<unsigned_char> local_52;
  uchar local_51;
  iterator local_50;
  size_type local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  prog_chunk local_28;
  vm_test_disassemble_bad_Test *local_10;
  vm_test_disassemble_bad_Test *this_local;
  
  local_51 = '\b';
  local_50 = &local_51;
  local_48 = 1;
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_52);
  __l_00._M_len = local_48;
  __l_00._M_array = local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_40,__l_00,&local_52);
  mvm::prog_chunk::prog_chunk(&local_28,&local_40);
  (anonymous_namespace)::vm_test::
  check_diassembler_nok<mvm::vm<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>>
            ((vm_test *)this,&(this->super_vm_test).vm1,&local_28,INVALID_INSTR_OPCODE);
  mvm::prog_chunk::~prog_chunk(&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  std::allocator<unsigned_char>::~allocator(&local_52);
  local_aa[0] = '\x01';
  local_aa[1] = 1;
  local_a8 = local_aa;
  local_a0 = 2;
  std::allocator<unsigned_char>::allocator(&local_ab);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_98,__l,&local_ab);
  mvm::prog_chunk::prog_chunk(&local_80,&local_98);
  (anonymous_namespace)::vm_test::
  check_diassembler_nok<mvm::vm<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>>
            ((vm_test *)this,&(this->super_vm_test).vm1,&local_80,CODE_OVERFLOW);
  mvm::prog_chunk::~prog_chunk(&local_80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_98);
  std::allocator<unsigned_char>::~allocator(&local_ab);
  return;
}

Assistant:

TEST_F(vm_test, disassemble_bad) {
  check_diassembler_nok(vm1, prog_chunk({0x8}),
                        status_type::INVALID_INSTR_OPCODE);
  check_diassembler_nok(vm1, prog_chunk({0x1, 0x1}),
                        status_type::CODE_OVERFLOW);
}